

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O2

void helper_gvec_sqadd_d_aarch64(void *vd,void *vq,void *vn,void *vm,uint32_t desc)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uintptr_t i;
  ulong uVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar2 = (desc & 0x1f) * 8 + 8;
  uVar5 = (ulong)uVar2;
  bVar6 = false;
  for (uVar7 = 0; uVar2 >> 3 != uVar7; uVar7 = uVar7 + 1) {
    uVar3 = *(ulong *)((long)vn + uVar7 * 8);
    uVar4 = *(ulong *)((long)vm + uVar7 * 8);
    uVar1 = uVar4 + uVar3;
    uVar8 = 0x8000000000000000;
    if (-1 < (long)uVar3) {
      uVar8 = 0x7fffffffffffffff;
    }
    bVar9 = (long)((uVar1 ^ uVar3) & ~(uVar4 ^ uVar3)) < 0;
    if (!bVar9) {
      uVar8 = uVar1;
    }
    bVar6 = (bool)(bVar6 | bVar9);
    *(ulong *)((long)vd + uVar7 * 8) = uVar8;
  }
  if (bVar6) {
    *(undefined4 *)vq = 1;
  }
  for (; uVar5 < (desc >> 2 & 0xf8) + 8; uVar5 = uVar5 + 8) {
    *(undefined8 *)((long)vd + uVar5) = 0;
  }
  return;
}

Assistant:

void HELPER(gvec_sqadd_d)(void *vd, void *vq, void *vn,
                          void *vm, uint32_t desc)
{
    intptr_t i, oprsz = simd_oprsz(desc);
    int64_t *d = vd, *n = vn, *m = vm;
    bool q = false;

    for (i = 0; i < oprsz / 8; i++) {
        int64_t nn = n[i], mm = m[i], dd = nn + mm;
        if (((dd ^ nn) & ~(nn ^ mm)) & INT64_MIN) {
            dd = (nn >> 63) ^ ~INT64_MIN;
            q = true;
        }
        d[i] = dd;
    }
    if (q) {
        uint32_t *qc = vq;
        qc[0] = 1;
    }
    clear_tail(d, oprsz, simd_maxsz(desc));
}